

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void __thiscall
glu::anon_unknown_4::VertexAttributeDescriptor::VertexAttributeDescriptor
          (VertexAttributeDescriptor *this,int location_,VertexComponentType componentType_,
          VertexComponentConversion convert_,int numComponents_,int numElements_,int stride_,
          void *pointer_)

{
  int numElements__local;
  int numComponents__local;
  VertexComponentConversion convert__local;
  VertexComponentType componentType__local;
  int location__local;
  VertexAttributeDescriptor *this_local;
  
  this->location = location_;
  this->componentType = componentType_;
  this->convert = convert_;
  this->numComponents = numComponents_;
  this->numElements = numElements_;
  this->stride = stride_;
  this->pointer = pointer_;
  return;
}

Assistant:

VertexAttributeDescriptor (int							location_,
							   VertexComponentType			componentType_,
							   VertexComponentConversion	convert_,
							   int							numComponents_,
							   int							numElements_,
							   int							stride_,
							   const void*					pointer_)
		: location		(location_)
		, componentType	(componentType_)
		, convert		(convert_)
		, numComponents	(numComponents_)
		, numElements	(numElements_)
		, stride		(stride_)
		, pointer		(pointer_)
	{
	}